

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IOEffect::Decode(IOEffect *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  IOEffect *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  StandardVariable::Decode(&this->super_StandardVariable,local_18);
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_StandardVariable).field_0xe);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_StandardVariable).field_0xf);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Eff);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8EffDtyCyc);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16EffDur);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Proc);
  KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  return;
}

Assistant:

void IOEffect::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IO_EFFECT_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    StandardVariable::Decode( stream );

    stream >> m_ui8Status
           >> m_ui8LnkTyp
           >> m_ui8Eff
           >> m_ui8EffDtyCyc
           >> m_ui16EffDur
           >> m_ui16Proc
           >> m_ui16Padding;
}